

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_outlets.h
# Opt level: O0

void __thiscall c74::max::t_mock_outlet::t_mock_outlet(t_mock_outlet *this,void *x,char *type)

{
  char *type_local;
  void *x_local;
  t_mock_outlet *this_local;
  
  this->m_owner = x;
  std::
  vector<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>,_std::allocator<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>_>_>
  ::vector(&this->m_messages);
  this->m_id = 0;
  this->m_type[0] = '\0';
  if (type != (char *)0x0) {
    strncpy(this->m_type,type,0x100);
  }
  m_id_counter = m_id_counter + 1;
  this->m_id = (long)m_id_counter;
  return;
}

Assistant:

t_mock_outlet(void *x, const char *type):
    m_owner(x), m_id(0)
    {
        m_type[0] = 0;
        if (type)
            strncpy(m_type, type, 256);
        m_id_counter++;
        m_id = m_id_counter;
    }